

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer * __thiscall
helics::typeConvert(SmallBuffer *__return_storage_ptr__,helics *this,DataType type,string_view val)

{
  value_t vVar1;
  json_value jVar2;
  string_view val_00;
  string *val_01;
  reference pvVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  helics *this_00;
  DataType outputType;
  undefined *puVar5;
  basic_string_view<char,_std::char_traits<char>_> *val_02;
  string_view val_03;
  string_view val_04;
  string_view val_05;
  string_view val_06;
  string_view val_07;
  string_view val_08;
  json json;
  _Alloc_hider in_stack_ffffffffffffff68;
  _Alloc_hider __src;
  _Alloc_hider _Var6;
  pointer local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  double local_78;
  data local_70;
  double local_60;
  data local_58;
  data local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  this_00 = (helics *)CONCAT44(in_register_00000014,type);
  pcVar4 = (char *)val._M_len;
  val_02 = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff68;
  outputType = (DataType)this;
  local_38._M_len = (size_t)this_00;
  local_38._M_str = pcVar4;
  if (this_00 == (helics *)0x0) {
    emptyBlock(__return_storage_ptr__,outputType,HELICS_ANY);
    return __return_storage_ptr__;
  }
  switch(outputType) {
  case HELICS_DOUBLE:
    val_03._M_str = pcVar4;
    val_03._M_len = (size_t)this_00;
    getDoubleFromString(val_03);
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&stack0xffffffffffffff68);
    return __return_storage_ptr__;
  case HELICS_INT:
    val_06._M_str = pcVar4;
    val_06._M_len = (size_t)this_00;
    getDoubleFromString(val_06);
    goto LAB_002254ae;
  case HELICS_COMPLEX:
    val_04._M_str = pcVar4;
    val_04._M_len = (size_t)this_00;
    helicsGetComplex(val_04);
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&stack0xffffffffffffff68);
    return __return_storage_ptr__;
  case HELICS_VECTOR:
    val_08._M_str = (char *)&switchD_00225187::switchdataD_003d30e8;
    val_08._M_len = (size_t)pcVar4;
    helicsGetVector((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff68,this_00,
                    val_08);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,
               (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff68);
    break;
  case HELICS_COMPLEX_VECTOR:
    val_07._M_str = (char *)&switchD_00225187::switchdataD_003d30e8;
    val_07._M_len = (size_t)pcVar4;
    helicsGetComplexVector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &stack0xffffffffffffff68,this_00,val_07);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
            &stack0xffffffffffffff68);
    break;
  case HELICS_NAMED_POINT:
    local_60 = nan("0");
    in_stack_ffffffffffffff68._M_p = (pointer)&local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff68,pcVar4,this_00 + (long)pcVar4);
    local_78 = local_60;
    ValueConverter<helics::NamedPoint>::convert
              (__return_storage_ptr__,(NamedPoint *)&stack0xffffffffffffff68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff68._M_p == &local_88) {
      return __return_storage_ptr__;
    }
    puVar5 = (undefined *)(local_88._M_allocated_capacity + 1);
    goto LAB_0022545f;
  case HELICS_BOOL:
    val_00._M_str = in_stack_ffffffffffffff68._M_p;
    val_00._M_len = 0x225471;
    helicsBoolValue(val_00);
    goto LAB_0022549a;
  case HELICS_TIME:
    val_05._M_str = pcVar4;
    val_05._M_len = (size_t)this_00;
    getDoubleFromString(val_05);
LAB_002254ae:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&stack0xffffffffffffff68);
    return __return_storage_ptr__;
  default:
    if (outputType == HELICS_JSON) {
      local_70.m_type = null;
      local_70.m_value.object = (object_t *)0x0;
      val_01 = typeNameStringRef_abi_cxx11_(HELICS_STRING);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,val_01);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70,"type");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_48.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_48.m_value;
      local_48.m_type = vVar1;
      local_48.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      __src._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff68,pcVar4,this_00 + (long)pcVar4);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_70,"value");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_58.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_58.m_value;
      local_58.m_type = vVar1;
      local_58.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__src._M_p != &local_88) {
        operator_delete(__src._M_p,(ulong)(local_88._M_allocated_capacity + 1));
      }
      fileops::generateJsonString((string *)&stack0xffffffffffffff68,(json *)&local_70,true);
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      _Var6._M_p = __src._M_p;
      SmallBuffer::reserve(__return_storage_ptr__,(size_t)local_90);
      __return_storage_ptr__->bufferSize = (size_t)local_90;
      memcpy(__return_storage_ptr__->heap,__src._M_p,(size_t)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var6._M_p != &local_88) {
        operator_delete(_Var6._M_p,(ulong)(local_88._M_allocated_capacity + 1));
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_70);
      return __return_storage_ptr__;
    }
    val_02 = &local_38;
LAB_0022549a:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,val_02);
    return __return_storage_ptr__;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_ffffffffffffff68._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    return __return_storage_ptr__;
  }
  puVar5 = (undefined *)(local_88._M_allocated_capacity - (long)in_stack_ffffffffffffff68._M_p);
LAB_0022545f:
  operator_delete(in_stack_ffffffffffffff68._M_p,(ulong)puVar5);
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, std::string_view val)
{
    if (val.empty()) {
        return emptyBlock(type);
    }

    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(getDoubleFromString(val));
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(getDoubleFromString(val)));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(
                Time(getDoubleFromString(val)).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(helicsGetComplex(val));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((helicsBoolValue(val)) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            return ValueConverter<std::string_view>::convert(val);
        case DataType::HELICS_NAMED_POINT:
            return ValueConverter<NamedPoint>::convert(NamedPoint{val, std::nan("0")});
        case DataType::HELICS_COMPLEX_VECTOR:
            return ValueConverter<std::vector<std::complex<double>>>::convert(
                helicsGetComplexVector(val));
        case DataType::HELICS_VECTOR:
            return ValueConverter<std::vector<double>>::convert(helicsGetVector(val));
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_STRING);
            json["value"] = std::string(val);
            return fileops::generateJsonString(json);
        }
    }
}